

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O3

KeyValue<supermap::Key<30UL>,_unsigned_long> * __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
::get(KeyValue<supermap::Key<30UL>,_unsigned_long> *__return_storage_ptr__,
     SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<30UL>_>_>_>
     *this,unsigned_long index)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer *__ptr;
  InputIterator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_38UL,_void>
  local_88;
  tuple<supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_> local_78;
  string local_70;
  path local_50;
  
  peVar1 = (this->storageFile_).
           super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = (peVar1->manager_).
           super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar1->manager_).
            super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>
  ::getStorageFilePath_abi_cxx11_
            (&local_70,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<30ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<30ul>>>>
              *)this);
  std::filesystem::__cxx11::path::path(&local_50,&local_70,auto_format);
  (**peVar2->_vptr_FileManager)(&local_78,peVar2,&local_50,index * 0x26);
  local_88.input_._M_t.
  super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>.
  _M_t.
  super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
  .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
        )(__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
          )local_78.
           super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
           .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl;
  local_88.index_ = 0;
  io::
  InputIterator<supermap::KeyValue<supermap::Key<30UL>,_unsigned_long>,_unsigned_long,_38UL,_void>::
  next(__return_storage_ptr__,&local_88);
  if ((_Head_base<0UL,_supermap::io::InputStream_*,_false>)
      local_88.input_._M_t.
      super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
      ._M_t.
      super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
      .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl !=
      (_Head_base<0UL,_supermap::io::InputStream_*,_false>)0x0) {
    (**(code **)(*(long *)local_88.input_._M_t.
                          super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
                          .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl +
                0x18))();
  }
  local_88.input_._M_t.
  super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>.
  _M_t.
  super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
  .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
        )(__uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
          )0x0;
  std::filesystem::__cxx11::path::~path(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }